

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::AssertData::StringContains::StringContains(StringContains *this,StringContains *param_1)

{
  StringContains *param_1_local;
  StringContains *this_local;
  
  Contains::Contains(&this->content,&param_1->content);
  this->isContains = (bool)(param_1->isContains & 1);
  return;
}

Assistant:

class DOCTEST_INTERFACE StringContains {
        private:
            Contains content;
            bool isContains;

        public:
            StringContains(const String& str) : content(str), isContains(false) { }
            StringContains(Contains cntn) : content(static_cast<Contains&&>(cntn)), isContains(true) { }

            bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }

            operator const String&() const { return content.string; }

            const char* c_str() const { return content.string.c_str(); }
    }